

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectivesParser.cpp
# Opt level: O0

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
parseDirectiveDefineLabel(Parser *parser,int flags,optional<bool> thumbMode)

{
  undefined8 __args_1;
  bool bVar1;
  Token *pTVar2;
  string *psVar3;
  undefined4 in_register_00000034;
  Parser *this;
  string local_a8;
  Identifier local_88;
  undefined1 local_68 [16];
  Identifier *identifier;
  undefined1 local_48 [8];
  Expression value;
  Token *tok;
  int flags_local;
  Parser *parser_local;
  optional<bool> thumbMode_local;
  
  this = (Parser *)CONCAT44(in_register_00000034,flags);
  value._16_8_ = Parser::nextToken(this);
  if (((Token *)value._16_8_)->type == Identifier) {
    pTVar2 = Parser::nextToken(this);
    if (pTVar2->type == Comma) {
      Parser::parseExpression((Expression *)local_48,this);
      bVar1 = Expression::isLoaded((Expression *)local_48);
      if (bVar1) {
        local_68._8_8_ = Token::identifierValue((Token *)value._16_8_);
        bVar1 = SymbolTable::isValidSymbolName((Identifier *)local_68._8_8_);
        __args_1 = local_68._8_8_;
        if (bVar1) {
          psVar3 = Token::getOriginalText_abi_cxx11_((Token *)value._16_8_);
          std::__cxx11::string::string((string *)&local_a8,(string *)psVar3);
          Identifier::Identifier(&local_88,&local_a8);
          std::
          make_unique<CAssemblerLabel,Identifier_const&,Identifier,Expression&,std::optional<bool>&>
                    ((Identifier *)local_68,(Identifier *)__args_1,(Expression *)&local_88,
                     (optional<bool> *)local_48);
          std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
          unique_ptr<CAssemblerLabel,std::default_delete<CAssemblerLabel>,void>
                    ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
                     (unique_ptr<CAssemblerLabel,_std::default_delete<CAssemblerLabel>_> *)local_68)
          ;
          std::unique_ptr<CAssemblerLabel,_std::default_delete<CAssemblerLabel>_>::~unique_ptr
                    ((unique_ptr<CAssemblerLabel,_std::default_delete<CAssemblerLabel>_> *)local_68)
          ;
          Identifier::~Identifier(&local_88);
          std::__cxx11::string::~string((string *)&local_a8);
        }
        else {
          Parser::printError<Identifier>
                    (this,(Token *)value._16_8_,"Invalid label name \"%s\"",
                     (Identifier *)local_68._8_8_);
          std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
          unique_ptr<std::default_delete<CAssemblerCommand>,void>
                    ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
                     (nullptr_t)0x0);
        }
      }
      else {
        std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
        unique_ptr<std::default_delete<CAssemblerCommand>,void>
                  ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
                   (nullptr_t)0x0);
      }
      identifier._0_4_ = 1;
      Expression::~Expression((Expression *)local_48);
    }
    else {
      std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
      unique_ptr<std::default_delete<CAssemblerCommand>,void>
                ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
                 (nullptr_t)0x0);
    }
  }
  else {
    std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
    unique_ptr<std::default_delete<CAssemblerCommand>,void>
              ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
               (nullptr_t)0x0);
  }
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> parseDirectiveDefineLabel(Parser& parser, int flags, std::optional<bool> thumbMode)
{
	const Token& tok = parser.nextToken();
	if (tok.type != TokenType::Identifier)
		return nullptr;

	if (parser.nextToken().type != TokenType::Comma)
		return nullptr;

	Expression value = parser.parseExpression();
	if (!value.isLoaded())
		return nullptr;

	const Identifier &identifier = tok.identifierValue();
	if (!Global.symbolTable.isValidSymbolName(identifier))
	{
		parser.printError(tok, "Invalid label name \"%s\"",identifier);
		return nullptr;
	}

	return std::make_unique<CAssemblerLabel>(identifier,Identifier(tok.getOriginalText()),value,thumbMode);
}